

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

Vec4 __thiscall
glu::TextureTestUtil::execSample
          (TextureTestUtil *this,Texture1DView *src,ReferenceParams *params,float s,float lod)

{
  float fVar1;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined8 uVar2;
  Vec4 VVar3;
  Vec4 VVar4;
  undefined8 uVar5;
  
  uVar2 = CONCAT44(in_XMM0_Db,s);
  if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
    fVar1 = tcu::Texture1DView::sampleCompare
                      (src,&params->sampler,(params->super_RenderParams).ref,s,lod);
    VVar3.m_data[1] = (float)extraout_XMM0_Db;
    VVar3.m_data[0] = fVar1;
    VVar3.m_data[2] = (float)(int)uVar2;
    VVar3.m_data[3] = (float)(int)((ulong)uVar2 >> 0x20);
    *(float *)this = fVar1;
    *(undefined8 *)(this + 4) = 0;
    *(undefined4 *)(this + 0xc) = 0x3f800000;
  }
  else {
    VVar3 = tcu::Texture1DView::sample((Texture1DView *)this,(Sampler *)src,s,lod);
  }
  VVar4.m_data[0] = VVar3.m_data[0];
  VVar4.m_data[1] = VVar3.m_data[1];
  register0x00001240 = VVar3.m_data[2];
  register0x00001244 = VVar3.m_data[3];
  return (Vec4)VVar4.m_data;
}

Assistant:

static inline tcu::Vec4 execSample (const tcu::Texture1DView& src, const ReferenceParams& params, float s, float lod)
{
	if (params.samplerType == SAMPLERTYPE_SHADOW)
		return tcu::Vec4(src.sampleCompare(params.sampler, params.ref, s, lod), 0.0, 0.0, 1.0f);
	else
		return src.sample(params.sampler, s, lod);
}